

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pfVar2;
  byte *pbVar3;
  byte *pbVar4;
  format_error *this;
  uint id;
  byte *pbVar5;
  basic_string_view<char> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  type local_38;
  
  if (begin == end) {
    __assert_fail("begin != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/include/fmt/format.h"
                  ,0x7b3,
                  "const Char *fmt::internal::parse_arg_id(const Char *, const Char *, IDHandler &&) [Char = char, IDHandler = fmt::internal::id_adapter<fmt::format_handler<fmt::arg_formatter<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>, char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>> &, char>]"
                 );
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pfVar2 = handler->handler;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_48.string,&pfVar2->context);
    (pfVar2->arg).type_ = local_38;
    (pfVar2->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar2->arg).value_.field_0.string.size = local_48.string.size;
    return begin;
  }
  if ((byte)(bVar1 - 0x30) < 10) {
    id = 0;
    pbVar4 = (byte *)(begin + 1);
    do {
      pbVar5 = pbVar4;
      if (0xccccccc < id) goto LAB_0013ef3c;
      id = ((uint)bVar1 + id * 10) - 0x30;
      if (pbVar5 == (byte *)end) {
        if ((int)id < 0) goto LAB_0013ef3c;
        goto LAB_0013ef5a;
      }
      bVar1 = *pbVar5;
      pbVar4 = pbVar5 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
    if ((int)id < 0) {
LAB_0013ef3c:
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
    }
    else {
      if ((bVar1 == 0x3a) || (bVar1 == 0x7d)) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_arg_id(handler->handler,id);
        return (char *)pbVar5;
      }
LAB_0013ef5a:
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"invalid format string");
    }
  }
  else {
    if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar4 = (byte *)(begin + 1);
      do {
        pbVar3 = pbVar4;
        pbVar5 = (byte *)end;
        if (pbVar3 == (byte *)end) break;
        bVar1 = *pbVar3;
        pbVar4 = pbVar3 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar5 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar5 - (long)begin;
      if (-1 < (long)name.size_) {
        pfVar2 = handler->handler;
        name.data_ = begin;
        basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
        ::get_arg((format_arg *)&local_48.string,&pfVar2->context,name);
        (pfVar2->arg).type_ = local_38;
        (pfVar2->arg).value_.field_0.long_long_value = local_48.long_long_value;
        (pfVar2->arg).value_.field_0.string.size = local_48.string.size;
        return (char *)pbVar5;
      }
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/include/fmt/core.h"
                    ,0xde,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"invalid format string");
  }
  __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    c = *++it;
  } while (it != end && (is_name_start(c) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}